

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

type * arithmetic_conversion(type *__return_storage_ptr__,type *type1,type *type2)

{
  int iVar1;
  int iVar2;
  basic_type local_148;
  undefined1 local_130 [8];
  type t;
  type local_c0;
  undefined1 local_88 [8];
  type t2;
  type t1;
  type *type2_local;
  type *type1_local;
  
  iVar1 = arithmetic_type_p(type1);
  if ((iVar1 == 0) || (iVar1 = arithmetic_type_p(type2), iVar1 == 0)) {
    __assert_fail("arithmetic_type_p (type1) && arithmetic_type_p (type2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x168f,
                  "struct type arithmetic_conversion(const struct type *, const struct type *)");
  }
  init_type(__return_storage_ptr__);
  __return_storage_ptr__->mode = TM_BASIC;
  iVar1 = floating_type_p(type1);
  if ((iVar1 == 0) && (iVar1 = floating_type_p(type2), iVar1 == 0)) {
    integer_promotion(&local_c0,type1);
    memcpy(&t2.u,&local_c0,0x38);
    integer_promotion((type *)&t.u,type2);
    memcpy(local_88,&t.u,0x38);
    iVar1 = signed_integer_type_p((type *)&t2.u);
    iVar2 = signed_integer_type_p((type *)local_88);
    if (iVar1 == iVar2) {
      if ((basic_type)t1.raw_size < (basic_type)t2.raw_size) {
        local_148 = (basic_type)t2.raw_size;
      }
      else {
        local_148 = (basic_type)t1.raw_size;
      }
      (__return_storage_ptr__->u).basic_type = local_148;
    }
    else {
      iVar1 = signed_integer_type_p((type *)&t2.u);
      if (iVar1 != 0) {
        memcpy(local_130,&t2.u,0x38);
        memcpy(&t2.u,local_88,0x38);
        memcpy(local_88,local_130,0x38);
      }
      iVar1 = signed_integer_type_p((type *)&t2.u);
      if ((iVar1 != 0) || (iVar1 = signed_integer_type_p((type *)local_88), iVar1 == 0)) {
        __assert_fail("!signed_integer_type_p (&t1) && signed_integer_type_p (&t2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x16a7,
                      "struct type arithmetic_conversion(const struct type *, const struct type *)")
        ;
      }
      if ((((basic_type)t1.raw_size == TP_ULONG) && ((basic_type)t2.raw_size < TP_LONG)) ||
         (((basic_type)t1.raw_size == TP_ULLONG && ((basic_type)t2.raw_size < TP_LLONG)))) {
        (__return_storage_ptr__->u).basic_type = (basic_type)t1.raw_size;
      }
      else if (((basic_type)t1.raw_size == TP_UINT) && (TP_UINT < (basic_type)t2.raw_size)) {
        (__return_storage_ptr__->u).basic_type = (basic_type)t2.raw_size;
      }
      else {
        (__return_storage_ptr__->u).basic_type = (basic_type)t1.raw_size;
      }
    }
  }
  else if (((type1->mode == TM_BASIC) && ((type1->u).basic_type == TP_LDOUBLE)) ||
          ((type2->mode == TM_BASIC && ((type2->u).basic_type == TP_LDOUBLE)))) {
    (__return_storage_ptr__->u).basic_type = TP_LDOUBLE;
  }
  else if (((type1->mode == TM_BASIC) && ((type1->u).basic_type == TP_DOUBLE)) ||
          ((type2->mode == TM_BASIC && ((type2->u).basic_type == TP_DOUBLE)))) {
    (__return_storage_ptr__->u).basic_type = TP_DOUBLE;
  }
  else if (((type1->mode == TM_BASIC) && ((type1->u).basic_type == TP_FLOAT)) ||
          ((type2->mode == TM_BASIC && ((type2->u).basic_type == TP_FLOAT)))) {
    (__return_storage_ptr__->u).basic_type = TP_FLOAT;
  }
  return __return_storage_ptr__;
}

Assistant:

static struct type arithmetic_conversion (const struct type *type1, const struct type *type2) {
  struct type res, t1, t2;

  assert (arithmetic_type_p (type1) && arithmetic_type_p (type2));
  init_type (&res);
  res.mode = TM_BASIC;
  if (floating_type_p (type1) || floating_type_p (type2)) {
    if ((type1->mode == TM_BASIC && type1->u.basic_type == TP_LDOUBLE)
        || (type2->mode == TM_BASIC && type2->u.basic_type == TP_LDOUBLE)) {
      res.u.basic_type = TP_LDOUBLE;
    } else if ((type1->mode == TM_BASIC && type1->u.basic_type == TP_DOUBLE)
               || (type2->mode == TM_BASIC && type2->u.basic_type == TP_DOUBLE)) {
      res.u.basic_type = TP_DOUBLE;
    } else if ((type1->mode == TM_BASIC && type1->u.basic_type == TP_FLOAT)
               || (type2->mode == TM_BASIC && type2->u.basic_type == TP_FLOAT)) {
      res.u.basic_type = TP_FLOAT;
    }
    return res;
  }
  t1 = integer_promotion (type1);
  t2 = integer_promotion (type2);
  if (signed_integer_type_p (&t1) == signed_integer_type_p (&t2)) {
    res.u.basic_type = t1.u.basic_type < t2.u.basic_type ? t2.u.basic_type : t1.u.basic_type;
  } else {
    struct type t;

    if (signed_integer_type_p (&t1)) SWAP (t1, t2, t);
    assert (!signed_integer_type_p (&t1) && signed_integer_type_p (&t2));
    if ((t1.u.basic_type == TP_ULONG && t2.u.basic_type < TP_LONG)
        || (t1.u.basic_type == TP_ULLONG && t2.u.basic_type < TP_LLONG)) {
      res.u.basic_type = t1.u.basic_type;
    } else if ((t1.u.basic_type == TP_UINT && t2.u.basic_type >= TP_LONG
                && MIR_LONG_MAX >= MIR_UINT_MAX)
               || (t1.u.basic_type == TP_ULONG && t2.u.basic_type >= TP_LLONG
                   && MIR_LLONG_MAX >= MIR_ULONG_MAX)) {
      res.u.basic_type = t2.u.basic_type;
    } else {
      res.u.basic_type = t1.u.basic_type;
    }
  }
  return res;
}